

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xpath_node_set_raw::remove_duplicates
          (xpath_node_set_raw *this,xpath_allocator *alloc)

{
  bool bVar1;
  xpath_node *pxVar2;
  xml_node_struct *local_b8;
  void *key;
  xml_node_struct *local_88;
  void *node;
  xml_node_struct *local_78;
  void *attr;
  xpath_node *it;
  xpath_node *write;
  void **local_50;
  void **hash_data;
  size_t hash_size;
  size_t size_;
  xpath_allocator_capture cr;
  xpath_allocator *alloc_local;
  xpath_node_set_raw *this_local;
  
  cr._state._error = (bool *)alloc;
  if ((this->_type == type_unsorted) && (2 < (long)this->_end - (long)this->_begin >> 4)) {
    xpath_allocator_capture::xpath_allocator_capture((xpath_allocator_capture *)&size_,alloc);
    hash_size = (long)this->_end - (long)this->_begin >> 4;
    for (hash_data = (void **)0x1; hash_data < (void **)(hash_size + (hash_size >> 1));
        hash_data = (void **)((long)hash_data << 1)) {
    }
    local_50 = (void **)xpath_allocator::allocate
                                  ((xpath_allocator *)cr._state._error,(long)hash_data << 3);
    if (local_50 == (void **)0x0) {
      write._0_4_ = 1;
    }
    else {
      memset(local_50,0,(long)hash_data << 3);
      it = this->_begin;
      for (attr = this->_begin; (xpath_node *)attr != this->_end; attr = (void *)((long)attr + 0x10)
          ) {
        node = (void *)xpath_node::attribute((xpath_node *)attr);
        local_78 = (xml_node_struct *)xml_attribute::internal_object((xml_attribute *)&node);
        key = (void *)xpath_node::node((xpath_node *)attr);
        local_88 = xml_node::internal_object((xml_node *)&key);
        local_b8 = local_88;
        if (local_78 != (xml_node_struct *)0x0) {
          local_b8 = local_78;
        }
        if ((local_b8 != (xml_node_struct *)0x0) &&
           (bVar1 = hash_insert(local_50,(size_t)hash_data,local_b8), bVar1)) {
          (it->_node)._root = *attr;
          (it->_attribute)._attr = *(xml_attribute_struct **)((long)attr + 8);
          it = it + 1;
        }
      }
      this->_end = it;
      write._0_4_ = 0;
    }
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&size_);
  }
  else {
    pxVar2 = (anonymous_namespace)::unique<pugi::xpath_node*>(this->_begin,this->_end);
    this->_end = pxVar2;
  }
  return;
}

Assistant:

void remove_duplicates(xpath_allocator* alloc)
		{
			if (_type == xpath_node_set::type_unsorted && _end - _begin > 2)
			{
				xpath_allocator_capture cr(alloc);

				size_t size_ = static_cast<size_t>(_end - _begin);

				size_t hash_size = 1;
				while (hash_size < size_ + size_ / 2) hash_size *= 2;

				const void** hash_data = static_cast<const void**>(alloc->allocate(hash_size * sizeof(void**)));
				if (!hash_data) return;

				memset(hash_data, 0, hash_size * sizeof(const void**));

				xpath_node* write = _begin;

				for (xpath_node* it = _begin; it != _end; ++it)
				{
					const void* attr = it->attribute().internal_object();
					const void* node = it->node().internal_object();
					const void* key = attr ? attr : node;

					if (key && hash_insert(hash_data, hash_size, key))
					{
						*write++ = *it;
					}
				}

				_end = write;
			}
			else
			{
				_end = unique(_begin, _end);
			}
		}